

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O2

_Bool is_number(char *name)

{
  ushort *puVar1;
  bool bVar2;
  int iVar3;
  ushort **ppuVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  
  ppuVar4 = __ctype_b_loc();
  puVar1 = *ppuVar4;
  if ((*(byte *)((long)puVar1 + (long)*name * 2 + 1) & 8) == 0) {
    bVar2 = false;
  }
  else {
    sVar5 = strlen(name);
    iVar3 = (int)sVar5;
    iVar6 = 1;
    if (1 < iVar3) {
      iVar6 = iVar3;
    }
    for (lVar7 = 1; lVar7 < iVar3; lVar7 = lVar7 + 1) {
      if ((*(byte *)((long)puVar1 + (long)name[lVar7] * 2 + 1) & 8) == 0) {
        iVar6 = (int)lVar7;
        break;
      }
    }
    bVar2 = iVar3 <= iVar6;
  }
  return bVar2;
}

Assistant:

static
bool is_number(
    const char *name)
{
    if (!isdigit(name[0])) {
        return false;
    }

    ecs_size_t i, s = ecs_os_strlen(name);
    for (i = 1; i < s; i ++) {
        if (!isdigit(name[i])) {
            break;
        }
    }

    return i >= s;
}